

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-left-rotation.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  size_type __n;
  reference pvVar1;
  ostream *poVar2;
  int local_4c;
  int local_48;
  int i_1;
  int i;
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> xs;
  int local_10;
  int shift;
  int length;
  
  shift = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (this,(int *)((long)&xs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 4));
  __n = (size_type)local_10;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__n,&local_31);
  std::allocator<int>::~allocator(&local_31);
  for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)local_48);
    std::istream::operator>>((istream *)&std::cin,pvVar1);
  }
  rotate((vector<int,_std::allocator<int>_> *)local_30,
         xs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ % local_10);
  for (local_4c = 0; local_4c < local_10; local_4c = local_4c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)local_4c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar1);
    std::operator<<(poVar2,' ');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  shift = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return shift;
}

Assistant:

int main() {
  int length, shift;
  std::cin >> length >> shift;
  std::vector<int> xs(length);
  for (int i = 0; i < length; ++i) {
    std::cin >> xs[i];
  }
  rotate(xs, shift % length);
  for (int i = 0; i < length; ++i) {
    std::cout << xs[i] << ' ';
  }
  std::cout << std::endl;
  return 0;
}